

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.cc
# Opt level: O3

int __thiscall xemmai::t_tuple::f_compare(t_tuple *this,t_tuple *a_other)

{
  t_pvalue *a_value;
  long lVar1;
  ulong uVar2;
  t_value<xemmai::t_slot> local_40;
  
  if (this == a_other) {
    return 0;
  }
  if (this->v_size == 0) {
    uVar2 = 0;
  }
  else {
    lVar1 = 8;
    uVar2 = 0;
    do {
      if (a_other->v_size <= uVar2) {
        return 1;
      }
      a_value = (t_pvalue *)((long)&this->v_size + lVar1);
      t_value<xemmai::t_slot>::f_equals(&local_40,a_value);
      if ((ulong)local_40.super_t_slot.v_p._M_b._M_p < (__pointer_type)0x2) {
        t_value<xemmai::t_slot>::f_less(&local_40,a_value);
        return ((ulong)local_40.super_t_slot.v_p._M_b._M_p < 2) - 1 | 1;
      }
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x10;
    } while (uVar2 < this->v_size);
  }
  return -(uint)(uVar2 < a_other->v_size);
}

Assistant:

int t_tuple::f_compare(const t_tuple& a_other) const
{
	if (this == &a_other) return 0;
	size_t i = 0;
	for (; i < v_size; ++i) {
		if (i >= a_other.f_size()) return 1;
		auto& x = (*this)[i];
		auto& y = a_other[i];
		if (!f_as<bool>(x.f_equals(y))) return f_as<bool>(x.f_less(y)) ? -1 : 1;
	}
	return i < a_other.f_size() ? -1 : 0;
}